

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O0

void cie_lab(double *p)

{
  double *in_RDI;
  double dVar1;
  double dVar2;
  anon_class_1_0_00000001 *this;
  anon_class_1_0_00000001 f;
  int j;
  double Zw;
  double Yw;
  double Xw;
  double Z;
  double Y;
  double X;
  double in_stack_ffffffffffffffb0;
  anon_class_1_0_00000001 *in_stack_ffffffffffffffb8;
  int local_3c;
  
  for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
  }
  dVar1 = cie_lab::anon_class_1_0_00000001::operator()
                    (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  *in_RDI = dVar1 * 116.0 - 16.0;
  dVar1 = cie_lab::anon_class_1_0_00000001::operator()
                    (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  dVar2 = cie_lab::anon_class_1_0_00000001::operator()(in_stack_ffffffffffffffb8,dVar1);
  in_RDI[1] = (dVar1 - dVar2) * 500.0;
  this = (anon_class_1_0_00000001 *)
         cie_lab::anon_class_1_0_00000001::operator()(in_stack_ffffffffffffffb8,dVar1);
  dVar1 = cie_lab::anon_class_1_0_00000001::operator()(this,dVar1);
  in_RDI[2] = ((double)this - dVar1) * 200.0;
  return;
}

Assistant:

void cie_lab(double *p) {
    double X = 0.0, Y = 0.0, Z = 0.0, Xw = xyz_whitepoint[0], Yw = xyz_whitepoint[1],
           Zw = xyz_whitepoint[2];

    for (int j = 0; j < 3; ++j) {
        X += p[j] * rgb_to_xyz[0][j];
        Y += p[j] * rgb_to_xyz[1][j];
        Z += p[j] * rgb_to_xyz[2][j];
    }

    auto f = [](double t) -> double {
        double delta = 6.0 / 29.0;
        if (t > delta * delta * delta)
            return cbrt(t);
        else
            return t / (delta * delta * 3.0) + (4.0 / 29.0);
    };

    p[0] = 116.0 * f(Y / Yw) - 16.0;
    p[1] = 500.0 * (f(X / Xw) - f(Y / Yw));
    p[2] = 200.0 * (f(Y / Yw) - f(Z / Zw));
}